

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall AbstractModuleClient::initializeHardwareConnection(AbstractModuleClient *this)

{
  bool bVar1;
  TrodesMsg *in_RDI;
  TrodesMsg m;
  TrodesMsg *in_stack_00000080;
  MlmWrap *in_stack_00000318;
  TrodesMsg *this_00;
  TrodesMsg *in_stack_ffffffffffffffa0;
  string local_58 [72];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  MlmWrap::subscribeStream
            ((MlmWrap *)m.format.field_2._M_allocated_capacity,(char *)m.format._M_string_length,
             (char *)m.format._0_8_);
  bVar1 = MlmWrap::init_hardware_connection(in_stack_00000318);
  if (bVar1) {
    TrodesMsg::TrodesMsg(in_stack_ffffffffffffffa0);
    this_00 = (TrodesMsg *)&stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"s",(allocator *)this_00);
    TrodesMsg::addcontents<char_const*>(in_stack_00000080,(string *)this,(char *)m.msg);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    bVar2 = MlmWrap::sendHardwareMessage
                      ((MlmWrap *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI);
    TrodesMsg::~TrodesMsg(this_00);
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool AbstractModuleClient::initializeHardwareConnection(){
    subscribeStream(TRODES_NETWORK_ID, hardware_update);
    if(init_hardware_connection()){
        //success, ask for hardware settings.
        TrodesMsg m;
        m.addcontents("s", "GETSETTINGS");
        if(sendHardwareMessage(m)){
            //success with get settings
            return true;
        }
        else{
            return false;
        }
    }
    else{
        return false;
    }
}